

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

int emitJump(uint8_t instruction)

{
  emitByte(instruction);
  emitByte(0xff);
  emitByte(0xff);
  return (current->function->chunk).count + -2;
}

Assistant:

static int emitJump(uint8_t instruction) {
    emitByte(instruction);
    emitByte(0xff);
    emitByte(0xff);
    return currentChunk()->count - 2;
}